

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_0::MergingIterator::MergingIterator
          (MergingIterator *this,Comparator *comparator,Iterator **children,int n)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  IteratorWrapper *pIVar5;
  ulong uVar6;
  IteratorWrapper *local_50;
  int local_28;
  int i;
  int n_local;
  Iterator **children_local;
  Comparator *comparator_local;
  MergingIterator *this_local;
  
  Iterator::Iterator(&this->super_Iterator);
  (this->super_Iterator)._vptr_Iterator = (_func_int **)&PTR__MergingIterator_00163640;
  this->comparator_ = comparator;
  uVar2 = (ulong)n;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0x20),0);
  uVar6 = uVar3 + 8;
  if (SUB168(auVar1 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar3) {
    uVar6 = 0xffffffffffffffff;
  }
  puVar4 = (ulong *)operator_new__(uVar6);
  *puVar4 = uVar2;
  pIVar5 = (IteratorWrapper *)(puVar4 + 1);
  if (uVar2 != 0) {
    local_50 = pIVar5;
    do {
      IteratorWrapper::IteratorWrapper(local_50);
      local_50 = local_50 + 1;
    } while (local_50 != pIVar5 + uVar2);
  }
  this->children_ = pIVar5;
  this->n_ = n;
  this->current_ = (IteratorWrapper *)0x0;
  this->direction_ = kForward;
  for (local_28 = 0; local_28 < n; local_28 = local_28 + 1) {
    IteratorWrapper::Set(this->children_ + local_28,children[local_28]);
  }
  return;
}

Assistant:

MergingIterator(const Comparator* comparator, Iterator** children, int n)
      : comparator_(comparator),
        children_(new IteratorWrapper[n]),
        n_(n),
        current_(nullptr),
        direction_(kForward) {
    for (int i = 0; i < n; i++) {
      children_[i].Set(children[i]);
    }
  }